

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O2

bool __thiscall
CoreML::Specification::TreeEnsembleParameters_TreeNode::MergePartialFromCodedStream
          (TreeEnsembleParameters_TreeNode *this,CodedInputStream *input)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  bool bVar4;
  uint32 uVar5;
  TreeEnsembleParameters_TreeNode_EvaluationInfo *value_00;
  char cVar6;
  uint uVar7;
  ulong uVar8;
  double *value_01;
  uint64 *value_02;
  int value;
  int local_6c;
  double *local_68;
  uint64 *local_60;
  double *local_58;
  uint64 *local_50;
  uint64 *local_48;
  bool *local_40;
  RepeatedPtrField<CoreML::Specification::TreeEnsembleParameters_TreeNode_EvaluationInfo> *local_38;
  
  local_68 = &this->relativehitrate_;
  local_38 = &this->evaluationinfo_;
  local_40 = &this->missingvaluetrackstruechild_;
  local_48 = &this->falsechildnodeid_;
  local_50 = &this->truechildnodeid_;
  local_58 = &this->branchfeaturevalue_;
  local_60 = &this->branchfeatureindex_;
LAB_0054d7d2:
  do {
    pbVar3 = input->buffer_;
    uVar5 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar2 = *pbVar3;
      uVar8 = (ulong)bVar2;
      pbVar1 = pbVar3 + 1;
      uVar7 = (uint)bVar2;
      if ((char)bVar2 < '\x01') {
        uVar5 = (uint)bVar2;
        if ((input->buffer_end_ <= pbVar1) || (uVar5 = uVar7, (~(uint)*pbVar1 & uVar7) < 0x80))
        goto LAB_0054d96d;
        uVar8 = (ulong)((uVar7 + (uint)*pbVar1 * 0x80) - 0x80);
        input->buffer_ = pbVar3 + 2;
      }
      else {
        input->buffer_ = pbVar1;
      }
      uVar8 = uVar8 | 0x100000000;
    }
    else {
LAB_0054d96d:
      uVar5 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar5);
      uVar8 = 0;
      if (uVar5 - 1 < 0x3fff) {
        uVar8 = 0x100000000;
      }
      uVar8 = uVar5 | uVar8;
    }
    uVar5 = (uint32)uVar8;
    if ((uVar8 & 0x100000000) == 0) goto switchD_0054d871_caseD_4;
    uVar7 = (uint)(uVar8 >> 3) & 0x1fffffff;
    cVar6 = (char)uVar8;
    switch(uVar7) {
    case 1:
      value_02 = &this->treeid_;
      if (cVar6 != '\b') break;
LAB_0054d947:
      bVar4 = google::protobuf::io::CodedInputStream::ReadVarint64(input,value_02);
      goto LAB_0054d84f;
    case 2:
      value_02 = &this->nodeid_;
      if (cVar6 == '\x10') goto LAB_0054d947;
      break;
    case 3:
      if (cVar6 == '\x18') {
        bVar4 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)14>
                          (input,&local_6c);
        if (!bVar4) {
          return false;
        }
        this->nodebehavior_ = local_6c;
        goto LAB_0054d7d2;
      }
      break;
    case 4:
    case 5:
    case 6:
    case 7:
    case 8:
    case 9:
    case 0xf:
    case 0x10:
    case 0x11:
    case 0x12:
    case 0x13:
      break;
    case 10:
      value_02 = local_60;
      if (cVar6 == 'P') goto LAB_0054d947;
      break;
    case 0xb:
      value_01 = local_58;
      if (cVar6 == 'Y') {
LAB_0054d8c8:
        bVar4 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<double,(google::protobuf::internal::WireFormatLite::FieldType)1>
                          (input,value_01);
        goto LAB_0054d84f;
      }
      break;
    case 0xc:
      value_02 = local_50;
      if (cVar6 == '`') goto LAB_0054d947;
      break;
    case 0xd:
      value_02 = local_48;
      if (cVar6 == 'h') goto LAB_0054d947;
      break;
    case 0xe:
      if (cVar6 == 'p') {
        bVar4 = google::protobuf::internal::WireFormatLite::
                ReadPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                          (input,local_40);
        goto LAB_0054d84f;
      }
      break;
    case 0x14:
      if (cVar6 == -0x5e) {
        value_00 = google::protobuf::
                   RepeatedPtrField<CoreML::Specification::TreeEnsembleParameters_TreeNode_EvaluationInfo>
                   ::Add(local_38);
        bVar4 = google::protobuf::internal::WireFormatLite::
                ReadMessageNoVirtual<CoreML::Specification::TreeEnsembleParameters_TreeNode_EvaluationInfo>
                          (input,value_00);
        goto LAB_0054d84f;
      }
      break;
    default:
      if ((uVar7 == 0x1e) && (value_01 = local_68, cVar6 == -0xf)) goto LAB_0054d8c8;
    }
switchD_0054d871_caseD_4:
    if (uVar5 == 0) {
      return true;
    }
    if ((uVar5 & 7) == 4) {
      return true;
    }
    bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar5);
LAB_0054d84f:
    if (bVar4 == false) {
      return false;
    }
  } while( true );
}

Assistant:

bool TreeEnsembleParameters_TreeNode::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.TreeEnsembleParameters.TreeNode)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // uint64 treeId = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &treeid_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // uint64 nodeId = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &nodeid_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.TreeEnsembleParameters.TreeNode.TreeNodeBehavior nodeBehavior = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(24u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          set_nodebehavior(static_cast< ::CoreML::Specification::TreeEnsembleParameters_TreeNode_TreeNodeBehavior >(value));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // uint64 branchFeatureIndex = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(80u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &branchfeatureindex_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // double branchFeatureValue = 11;
      case 11: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(89u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 input, &branchfeaturevalue_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // uint64 trueChildNodeId = 12;
      case 12: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(96u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &truechildnodeid_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // uint64 falseChildNodeId = 13;
      case 13: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(104u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &falsechildnodeid_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool missingValueTracksTrueChild = 14;
      case 14: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(112u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &missingvaluetrackstruechild_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .CoreML.Specification.TreeEnsembleParameters.TreeNode.EvaluationInfo evaluationInfo = 20;
      case 20: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(162u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_evaluationinfo()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // double relativeHitRate = 30;
      case 30: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(241u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 input, &relativehitrate_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.TreeEnsembleParameters.TreeNode)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.TreeEnsembleParameters.TreeNode)
  return false;
#undef DO_
}